

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

JumpStatementSyntax * __thiscall
slang::parsing::Parser::parseJumpStatement(Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  Token breakOrContinue;
  Token semi_00;
  JumpStatementSyntax *pJVar1;
  undefined8 in_RSI;
  __extent_storage<18446744073709551615UL> in_RDI;
  Token TVar2;
  Token semi;
  Token keyword;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffff30;
  pointer in_stack_ffffffffffffff38;
  ParserBase *in_stack_ffffffffffffff50;
  TokenKind in_stack_ffffffffffffffbe;
  ParserBase *in_stack_ffffffffffffffc0;
  undefined8 local_38;
  
  ParserBase::consume(in_stack_ffffffffffffff50);
  TVar2 = ParserBase::expect(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe);
  elements._M_extent._M_extent_value = in_RDI._M_extent_value;
  elements._M_ptr = in_stack_ffffffffffffff38;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            (in_stack_ffffffffffffff30,elements);
  local_38 = TVar2.info;
  breakOrContinue.info = (Info *)in_RDI._M_extent_value;
  breakOrContinue._0_8_ = in_stack_ffffffffffffff38;
  semi_00.info = (Info *)TVar2._0_8_;
  semi_00.kind = (short)in_RSI;
  semi_00._2_1_ = (char)((ulong)in_RSI >> 0x10);
  semi_00.numFlags.raw = (char)((ulong)in_RSI >> 0x18);
  semi_00.rawLen = (int)((ulong)in_RSI >> 0x20);
  pJVar1 = slang::syntax::SyntaxFactory::jumpStatement
                     ((SyntaxFactory *)local_38,TVar2._0_8_,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)0xa6770d,breakOrContinue
                      ,semi_00);
  return pJVar1;
}

Assistant:

JumpStatementSyntax& Parser::parseJumpStatement(NamedLabelSyntax* label, AttrList attributes) {
    auto keyword = consume();
    auto semi = expect(TokenKind::Semicolon);
    return factory.jumpStatement(label, attributes, keyword, semi);
}